

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> * __thiscall
helics::TimeCoordinator::getDependencies(TimeCoordinator *this)

{
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *in_RDI;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *unaff_retaddr;
  shared_guarded<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
  *in_stack_ffffffffffffffa8;
  shared_lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
  local_28;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *__x;
  
  __x = in_RDI;
  gmlc::libguarded::
  shared_guarded<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
  ::lock_shared(in_stack_ffffffffffffffa8);
  gmlc::libguarded::
  shared_lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
  ::operator*(&local_28);
  std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::vector
            (unaff_retaddr,__x);
  gmlc::libguarded::
  shared_lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
              *)0x5524f9);
  return in_RDI;
}

Assistant:

std::vector<GlobalFederateId> TimeCoordinator::getDependencies() const
{
    return *dependency_federates.lock_shared();
}